

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

string * __thiscall
higan::Buffer::ReadAllAsString_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = this->read_idx_;
  sVar3 = this->write_idx_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1 + sVar2,pcVar1 + sVar3);
  uVar4 = (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (this->write_idx_ < uVar4) {
    uVar4 = this->write_idx_;
  }
  this->read_idx_ = uVar4;
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::ReadAllAsString()
{
	std::string result(ReadBegin(), ReadableSize());
	AddReadIndex(ReadableSize());
	return result;
}